

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_patternstring.cpp
# Opt level: O2

UnicodeString *
icu_63::number::impl::PatternStringUtils::convertLocalized
          (UnicodeString *__return_storage_ptr__,UnicodeString *input,DecimalFormatSymbols *symbols,
          bool toLocalized,UErrorCode *status)

{
  short sVar1;
  bool bVar2;
  UBool UVar3;
  char16_t srcChar;
  int iVar4;
  long lVar5;
  UnicodeString *pUVar6;
  int32_t offset;
  UnicodeString *src;
  uint uVar7;
  int32_t iVar8;
  UnicodeString temp;
  UnicodeString local_af8;
  UnicodeString local_ab8 [42];
  
  lVar5 = 8;
  do {
    *(undefined ***)((long)local_ab8 + lVar5 + -8) = &PTR__UnicodeString_00471e80;
    *(undefined2 *)((long)&local_ab8[0].super_Replaceable.super_UObject._vptr_UObject + lVar5) = 2;
    lVar5 = lVar5 + 0x40;
  } while (lVar5 != 0xa88);
  icu_63::UnicodeString::UnicodeString(&temp,L"%");
  bVar2 = !toLocalized;
  icu_63::UnicodeString::moveFrom(local_ab8 + bVar2,&temp);
  icu_63::UnicodeString::~UnicodeString(&temp);
  icu_63::UnicodeString::operator=(local_ab8 + toLocalized,(UnicodeString *)&symbols->field_0xc8);
  icu_63::UnicodeString::UnicodeString(&temp,L"‰");
  icu_63::UnicodeString::moveFrom(local_ab8 + (ulong)bVar2 + 2,&temp);
  icu_63::UnicodeString::~UnicodeString(&temp);
  icu_63::UnicodeString::operator=
            (local_ab8 + (ulong)toLocalized + 2,(UnicodeString *)&symbols->field_0x308);
  icu_63::UnicodeString::UnicodeString(&temp,L".");
  icu_63::UnicodeString::moveFrom(local_ab8 + (ulong)bVar2 + 4,&temp);
  icu_63::UnicodeString::~UnicodeString(&temp);
  icu_63::UnicodeString::operator=
            (local_ab8 + (ulong)toLocalized + 4,(UnicodeString *)&symbols->field_0x8);
  icu_63::UnicodeString::UnicodeString(&temp,L",");
  icu_63::UnicodeString::moveFrom(local_ab8 + (ulong)bVar2 + 6,&temp);
  icu_63::UnicodeString::~UnicodeString(&temp);
  icu_63::UnicodeString::operator=
            (local_ab8 + (ulong)toLocalized + 6,(UnicodeString *)&symbols->field_0x48);
  icu_63::UnicodeString::UnicodeString(&temp,L"-");
  icu_63::UnicodeString::moveFrom(local_ab8 + (ulong)bVar2 + 8,&temp);
  icu_63::UnicodeString::~UnicodeString(&temp);
  icu_63::UnicodeString::operator=
            (local_ab8 + (ulong)toLocalized + 8,(UnicodeString *)&symbols->field_0x188);
  icu_63::UnicodeString::UnicodeString(&temp,L"+");
  icu_63::UnicodeString::moveFrom(local_ab8 + (ulong)bVar2 + 10,&temp);
  icu_63::UnicodeString::~UnicodeString(&temp);
  icu_63::UnicodeString::operator=
            (local_ab8 + (ulong)toLocalized + 10,(UnicodeString *)&symbols->field_0x1c8);
  icu_63::UnicodeString::UnicodeString(&temp,L";");
  icu_63::UnicodeString::moveFrom(local_ab8 + (ulong)bVar2 + 0xc,&temp);
  icu_63::UnicodeString::~UnicodeString(&temp);
  icu_63::UnicodeString::operator=
            (local_ab8 + (ulong)toLocalized + 0xc,(UnicodeString *)&symbols->field_0x88);
  icu_63::UnicodeString::UnicodeString(&temp,L"@");
  icu_63::UnicodeString::moveFrom(local_ab8 + (ulong)bVar2 + 0xe,&temp);
  icu_63::UnicodeString::~UnicodeString(&temp);
  icu_63::UnicodeString::operator=
            (local_ab8 + (ulong)toLocalized + 0xe,(UnicodeString *)&symbols->field_0x408);
  icu_63::UnicodeString::UnicodeString(&temp,L"E");
  icu_63::UnicodeString::moveFrom(local_ab8 + (ulong)bVar2 + 0x10,&temp);
  icu_63::UnicodeString::~UnicodeString(&temp);
  icu_63::UnicodeString::operator=
            (local_ab8 + (ulong)toLocalized + 0x10,(UnicodeString *)&symbols->field_0x2c8);
  icu_63::UnicodeString::UnicodeString(&temp,L"*");
  icu_63::UnicodeString::moveFrom(local_ab8 + (ulong)bVar2 + 0x12,&temp);
  icu_63::UnicodeString::~UnicodeString(&temp);
  icu_63::UnicodeString::operator=
            (local_ab8 + (ulong)toLocalized + 0x12,(UnicodeString *)&symbols->field_0x348);
  icu_63::UnicodeString::UnicodeString(&temp,L"#");
  icu_63::UnicodeString::moveFrom(local_ab8 + (ulong)bVar2 + 0x14,&temp);
  icu_63::UnicodeString::~UnicodeString(&temp);
  icu_63::UnicodeString::operator=
            (local_ab8 + (ulong)toLocalized + 0x14,(UnicodeString *)&symbols->field_0x148);
  pUVar6 = (UnicodeString *)&symbols->field_0x448;
  uVar7 = 0;
  for (lVar5 = 0; lVar5 != 0x500; lVar5 = lVar5 + 0x80) {
    icu_63::UnicodeString::operator=
              ((UnicodeString *)
               ((long)&local_ab8[(ulong)bVar2 + 0x16].super_Replaceable.super_UObject._vptr_UObject
               + lVar5),uVar7 | 0x30);
    src = pUVar6;
    if (lVar5 == 0) {
      src = (UnicodeString *)&symbols->field_0x108;
    }
    icu_63::UnicodeString::operator=
              ((UnicodeString *)
               ((long)&local_ab8[(ulong)toLocalized + 0x16].super_Replaceable.super_UObject.
                       _vptr_UObject + lVar5),src);
    uVar7 = uVar7 + 1;
    pUVar6 = pUVar6 + 1;
  }
  for (lVar5 = 0; lVar5 != 0xa80; lVar5 = lVar5 + 0x80) {
    icu_63::UnicodeString::UnicodeString(&temp,L'\'');
    icu_63::UnicodeString::UnicodeString(&local_af8,L'’');
    icu_63::UnicodeString::findAndReplace
              ((UnicodeString *)
               ((long)&local_ab8[toLocalized].super_Replaceable.super_UObject._vptr_UObject + lVar5)
               ,&temp,&local_af8);
    icu_63::UnicodeString::~UnicodeString(&local_af8);
    icu_63::UnicodeString::~UnicodeString(&temp);
  }
  (__return_storage_ptr__->super_Replaceable).super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_00471e80;
  (__return_storage_ptr__->fUnion).fStackFields.fLengthAndFlags = 2;
  offset = 0;
  uVar7 = 0;
LAB_0029f943:
  sVar1 = (input->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar4 = (input->fUnion).fFields.fLength;
  }
  else {
    iVar4 = (int)sVar1 >> 5;
  }
  if (iVar4 <= offset) {
    if (uVar7 - 3 < 2) {
      icu_63::UnicodeString::append(__return_storage_ptr__,L'\'');
    }
    else if (uVar7 != 0) {
      *status = U_PATTERN_SYNTAX_ERROR;
    }
    lVar5 = 0xa40;
    do {
      icu_63::UnicodeString::~UnicodeString
                ((UnicodeString *)
                 ((long)&local_ab8[0].super_Replaceable.super_UObject._vptr_UObject + lVar5));
      lVar5 = lVar5 + -0x40;
    } while (lVar5 != -0x40);
    return __return_storage_ptr__;
  }
  srcChar = icu_63::UnicodeString::doCharAt(input,offset);
  if (srcChar == L'\'') {
    switch(uVar7) {
    case 0:
      icu_63::UnicodeString::append(__return_storage_ptr__,L'\'');
      uVar7 = 1;
      break;
    case 2:
      uVar7 = 3;
      break;
    case 4:
      uVar7 = 5;
      break;
    default:
      icu_63::UnicodeString::append(__return_storage_ptr__,L'\'');
      icu_63::UnicodeString::append(__return_storage_ptr__,L'\'');
      uVar7 = 4;
    }
  }
  else if ((uVar7 < 5) && ((0x19U >> uVar7 & 1) != 0)) {
    lVar5 = 0xa80;
    pUVar6 = local_ab8;
    do {
      if (lVar5 == 0) {
        lVar5 = 0xa80;
        pUVar6 = local_ab8 + 1;
        goto LAB_0029fa8a;
      }
      sVar1 = (pUVar6->fUnion).fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        iVar8 = (pUVar6->fUnion).fFields.fLength;
      }
      else {
        iVar8 = (int)sVar1 >> 5;
      }
      icu_63::UnicodeString::tempSubString(&temp,input,offset,iVar8);
      UVar3 = icu_63::UnicodeString::operator==(&temp,pUVar6);
      if (UVar3 != '\0') {
        sVar1 = (pUVar6->fUnion).fStackFields.fLengthAndFlags;
        if (sVar1 < 0) {
          iVar8 = (pUVar6->fUnion).fFields.fLength;
        }
        else {
          iVar8 = (int)sVar1 >> 5;
        }
        if (uVar7 - 3 < 2) {
          uVar7 = 0;
          icu_63::UnicodeString::append(__return_storage_ptr__,L'\'');
        }
        icu_63::UnicodeString::append(__return_storage_ptr__,pUVar6 + 1);
        offset = offset + iVar8 + -1;
      }
      icu_63::UnicodeString::~UnicodeString(&temp);
      lVar5 = lVar5 + -0x80;
      pUVar6 = pUVar6 + 2;
    } while (UVar3 == '\0');
  }
  else {
    icu_63::UnicodeString::append(__return_storage_ptr__,srcChar);
    uVar7 = 2;
  }
  goto LAB_0029fb95;
  while( true ) {
    sVar1 = (pUVar6->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar8 = (pUVar6->fUnion).fFields.fLength;
    }
    else {
      iVar8 = (int)sVar1 >> 5;
    }
    icu_63::UnicodeString::tempSubString(&temp,input,offset,iVar8);
    UVar3 = icu_63::UnicodeString::operator==(&temp,pUVar6);
    if (UVar3 != '\0') {
      if (uVar7 == 0) {
        icu_63::UnicodeString::append(__return_storage_ptr__,L'\'');
        uVar7 = 4;
      }
      icu_63::UnicodeString::append(__return_storage_ptr__,srcChar);
    }
    icu_63::UnicodeString::~UnicodeString(&temp);
    lVar5 = lVar5 + -0x80;
    pUVar6 = pUVar6 + 2;
    if (UVar3 != '\0') break;
LAB_0029fa8a:
    if (lVar5 == 0) {
      if (uVar7 - 3 < 2) {
        uVar7 = 0;
        icu_63::UnicodeString::append(__return_storage_ptr__,L'\'');
      }
      icu_63::UnicodeString::append(__return_storage_ptr__,srcChar);
      break;
    }
  }
LAB_0029fb95:
  offset = offset + 1;
  goto LAB_0029f943;
}

Assistant:

UnicodeString
PatternStringUtils::convertLocalized(const UnicodeString& input, const DecimalFormatSymbols& symbols,
                                     bool toLocalized, UErrorCode& status) {
    // Construct a table of strings to be converted between localized and standard.
    static constexpr int32_t LEN = 21;
    UnicodeString table[LEN][2];
    int standIdx = toLocalized ? 0 : 1;
    int localIdx = toLocalized ? 1 : 0;
    table[0][standIdx] = u"%";
    table[0][localIdx] = symbols.getConstSymbol(DecimalFormatSymbols::kPercentSymbol);
    table[1][standIdx] = u"‰";
    table[1][localIdx] = symbols.getConstSymbol(DecimalFormatSymbols::kPerMillSymbol);
    table[2][standIdx] = u".";
    table[2][localIdx] = symbols.getConstSymbol(DecimalFormatSymbols::kDecimalSeparatorSymbol);
    table[3][standIdx] = u",";
    table[3][localIdx] = symbols.getConstSymbol(DecimalFormatSymbols::kGroupingSeparatorSymbol);
    table[4][standIdx] = u"-";
    table[4][localIdx] = symbols.getConstSymbol(DecimalFormatSymbols::kMinusSignSymbol);
    table[5][standIdx] = u"+";
    table[5][localIdx] = symbols.getConstSymbol(DecimalFormatSymbols::kPlusSignSymbol);
    table[6][standIdx] = u";";
    table[6][localIdx] = symbols.getConstSymbol(DecimalFormatSymbols::kPatternSeparatorSymbol);
    table[7][standIdx] = u"@";
    table[7][localIdx] = symbols.getConstSymbol(DecimalFormatSymbols::kSignificantDigitSymbol);
    table[8][standIdx] = u"E";
    table[8][localIdx] = symbols.getConstSymbol(DecimalFormatSymbols::kExponentialSymbol);
    table[9][standIdx] = u"*";
    table[9][localIdx] = symbols.getConstSymbol(DecimalFormatSymbols::kPadEscapeSymbol);
    table[10][standIdx] = u"#";
    table[10][localIdx] = symbols.getConstSymbol(DecimalFormatSymbols::kDigitSymbol);
    for (int i = 0; i < 10; i++) {
        table[11 + i][standIdx] = u'0' + i;
        table[11 + i][localIdx] = symbols.getConstDigitSymbol(i);
    }

    // Special case: quotes are NOT allowed to be in any localIdx strings.
    // Substitute them with '’' instead.
    for (int32_t i = 0; i < LEN; i++) {
        table[i][localIdx].findAndReplace(u'\'', u'’');
    }

    // Iterate through the string and convert.
    // State table:
    // 0 => base state
    // 1 => first char inside a quoted sequence in input and output string
    // 2 => inside a quoted sequence in input and output string
    // 3 => first char after a close quote in input string;
    // close quote still needs to be written to output string
    // 4 => base state in input string; inside quoted sequence in output string
    // 5 => first char inside a quoted sequence in input string;
    // inside quoted sequence in output string
    UnicodeString result;
    int state = 0;
    for (int offset = 0; offset < input.length(); offset++) {
        UChar ch = input.charAt(offset);

        // Handle a quote character (state shift)
        if (ch == u'\'') {
            if (state == 0) {
                result.append(u'\'');
                state = 1;
                continue;
            } else if (state == 1) {
                result.append(u'\'');
                state = 0;
                continue;
            } else if (state == 2) {
                state = 3;
                continue;
            } else if (state == 3) {
                result.append(u'\'');
                result.append(u'\'');
                state = 1;
                continue;
            } else if (state == 4) {
                state = 5;
                continue;
            } else {
                U_ASSERT(state == 5);
                result.append(u'\'');
                result.append(u'\'');
                state = 4;
                continue;
            }
        }

        if (state == 0 || state == 3 || state == 4) {
            for (auto& pair : table) {
                // Perform a greedy match on this symbol string
                UnicodeString temp = input.tempSubString(offset, pair[0].length());
                if (temp == pair[0]) {
                    // Skip ahead past this region for the next iteration
                    offset += pair[0].length() - 1;
                    if (state == 3 || state == 4) {
                        result.append(u'\'');
                        state = 0;
                    }
                    result.append(pair[1]);
                    goto continue_outer;
                }
            }
            // No replacement found. Check if a special quote is necessary
            for (auto& pair : table) {
                UnicodeString temp = input.tempSubString(offset, pair[1].length());
                if (temp == pair[1]) {
                    if (state == 0) {
                        result.append(u'\'');
                        state = 4;
                    }
                    result.append(ch);
                    goto continue_outer;
                }
            }
            // Still nothing. Copy the char verbatim. (Add a close quote if necessary)
            if (state == 3 || state == 4) {
                result.append(u'\'');
                state = 0;
            }
            result.append(ch);
        } else {
            U_ASSERT(state == 1 || state == 2 || state == 5);
            result.append(ch);
            state = 2;
        }
        continue_outer:;
    }
    // Resolve final quotes
    if (state == 3 || state == 4) {
        result.append(u'\'');
        state = 0;
    }
    if (state != 0) {
        // Malformed localized pattern: unterminated quote
        status = U_PATTERN_SYNTAX_ERROR;
    }
    return result;
}